

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O2

void __thiscall
cmComputeLinkDepends::QueueSharedDependencies
          (cmComputeLinkDepends *this,int depender_index,
          vector<cmLinkItem,_std::allocator<cmLinkItem>_> *deps)

{
  pointer pcVar1;
  pointer pcVar2;
  SharedDepEntry qe;
  value_type vStack_68;
  
  pcVar1 = (deps->super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (pcVar2 = (deps->super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>)._M_impl.
                super__Vector_impl_data._M_start; pcVar2 != pcVar1; pcVar2 = pcVar2 + 1) {
    cmLinkItem::cmLinkItem(&vStack_68.Item);
    cmLinkItem::operator=(&vStack_68.Item,pcVar2);
    vStack_68.DependerIndex = depender_index;
    std::
    deque<cmComputeLinkDepends::SharedDepEntry,_std::allocator<cmComputeLinkDepends::SharedDepEntry>_>
    ::push_back(&(this->SharedDepQueue).c,&vStack_68);
    cmLinkItem::~cmLinkItem(&vStack_68.Item);
  }
  return;
}

Assistant:

void cmComputeLinkDepends::QueueSharedDependencies(
  int depender_index, std::vector<cmLinkItem> const& deps)
{
  for (cmLinkItem const& li : deps) {
    SharedDepEntry qe;
    qe.Item = li;
    qe.DependerIndex = depender_index;
    this->SharedDepQueue.push(qe);
  }
}